

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  uint uVar3;
  int iVar4;
  _Base_ptr p_Var5;
  string *psVar6;
  pointer pcVar7;
  Result *this_00;
  iterator iVar8;
  NeuralNetworkLayer *pNVar9;
  bool bVar10;
  LayerUnion LVar11;
  long *plVar12;
  LogMessage *pLVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  undefined8 *puVar15;
  _Base_ptr p_Var16;
  int **ppiVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  _Alloc_hider _Var22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  _Rb_tree_header *p_Var25;
  int iVar26;
  string err_2;
  int a;
  vector<int,_std::allocator<int>_> axes;
  string err;
  Result r;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_188;
  uint local_168;
  int local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Result *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  iterator iStack_110;
  int *local_108;
  NeuralNetworkLayer *local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  int *local_b0;
  _Alloc_hider _Stack_a8;
  size_type *local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  Result::Result((Result *)&local_88);
  validateInputCount((Result *)local_f8,layer,1,1);
  local_88 = (size_type *)local_f8;
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
  if (local_f0._M_p != local_e8 + 8) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  bVar10 = Result::good((Result *)&local_88);
  if (bVar10) {
    validateOutputCount((Result *)local_f8,layer,1,1);
    local_88 = (size_type *)local_f8;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x460) {
    LVar11 = layer->layer_;
  }
  else {
    LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
  }
  if ((LVar11.squeeze_)->squeezeall_ == false) {
    if (layer->_oneof_case_[0] == 0x460) {
      LVar11 = layer->layer_;
    }
    else {
      LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
    }
    if (((LVar11.convolution_)->kernelsize_).current_size_ == 0) {
      psVar6 = (layer->name_).ptr_;
      pp_Var2 = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      local_60._M_impl._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar7,pcVar7 + psVar6->_M_string_length);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x32ac08);
      ppiVar17 = (int **)(plVar12 + 2);
      if ((int **)*plVar12 == ppiVar17) {
        local_b0 = *ppiVar17;
        _Stack_a8._M_p = (pointer)plVar12[3];
        local_c0._0_8_ = &local_b0;
      }
      else {
        local_b0 = *ppiVar17;
        local_c0._0_8_ = (int **)*plVar12;
      }
      local_c0._8_8_ = plVar12[1];
      *plVar12 = (long)ppiVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append(local_c0);
      psVar18 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar18) {
        local_e8._0_8_ = *psVar18;
        local_e8._8_8_ = plVar12[3];
        local_f8 = (undefined1  [8])local_e8;
      }
      else {
        local_e8._0_8_ = *psVar18;
        local_f8 = (undefined1  [8])*plVar12;
      }
      local_f0._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((int **)local_c0._0_8_ != &local_b0) {
        operator_delete((void *)local_c0._0_8_,(long)local_b0 + 1);
      }
      if ((_Base_ptr *)local_60._M_impl._0_8_ != pp_Var2) {
        operator_delete((void *)local_60._M_impl._0_8_,
                        (ulong)((long)&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
      if (local_f8 != (undefined1  [8])local_e8) {
        operator_delete((void *)local_f8,local_e8._0_8_ + 1);
      }
      goto LAB_002e765b;
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar26 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_140 = __return_storage_ptr__;
    local_100 = layer;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (local_100->_oneof_case_[0] == 0x460) {
        LVar11 = local_100->layer_;
      }
      else {
        LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
      }
      pNVar9 = local_100;
      this_00 = local_140;
      if (((LVar11.convolution_)->kernelsize_).current_size_ <= iVar26) {
        __return_storage_ptr__ = local_140;
        if (((local_100->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
           ((local_100->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1))
        goto LAB_002e7470;
        if ((local_100->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_c0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c0);
        }
        uVar3 = *(uint *)((long)((pNVar9->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x24);
        if ((pNVar9->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_f8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_f8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_188,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f8);
        }
        iVar26 = *(int *)((long)((pNVar9->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x24);
        local_168 = uVar3;
        if (pNVar9->_oneof_case_[0] == 0x460) {
          LVar11 = pNVar9->layer_;
        }
        else {
          LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
        }
        iVar4 = ((LVar11.convolution_)->kernelsize_).current_size_;
        if ((local_168 == 1) || (iVar26 + iVar4 == local_168)) {
          local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          iStack_110._M_current = (int *)0x0;
          local_108 = (int *)0x0;
          if (iVar4 < 1) goto LAB_002e73d4;
          iVar26 = 0;
          goto LAB_002e71ec;
        }
        psVar6 = (pNVar9->name_).ptr_;
        pcVar7 = (psVar6->_M_dataplus)._M_p;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar7,pcVar7 + psVar6->_M_string_length);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x32ac08);
        psVar18 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_160.field_2._M_allocated_capacity = *psVar18;
          local_160.field_2._8_8_ = plVar12[3];
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar18;
          local_160._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_160._M_string_length = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
        psVar18 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_188.field_2._M_allocated_capacity = *psVar18;
          local_188.field_2._8_8_ = puVar15[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar18;
          local_188._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_188._M_string_length = puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        Result::Result(this_00,INVALID_MODEL_PARAMETERS,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          uVar21 = local_188.field_2._M_allocated_capacity + 1;
          _Var22._M_p = local_188._M_dataplus._M_p;
          goto LAB_002e7644;
        }
        break;
      }
      if (local_100->_oneof_case_[0] == 0x460) {
        LVar11 = local_100->layer_;
      }
      else {
        LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
      }
      plVar12 = google::protobuf::RepeatedField<long>::Get(&(LVar11.reshape_)->targetshape_,iVar26);
      iVar4 = (int)*plVar12;
      local_160._M_dataplus._M_p._0_4_ = iVar4;
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      p_Var16 = &p_Var1->_M_header;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < iVar4]) {
        if (iVar4 <= (int)*(size_t *)(p_Var5 + 1)) {
          p_Var16 = p_Var5;
        }
      }
      p_Var25 = p_Var1;
      if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
         (p_Var25 = (_Rb_tree_header *)p_Var16,
         iVar4 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
        p_Var25 = p_Var1;
      }
      if (p_Var25 == p_Var1) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,(int *)&local_160);
      }
      else {
        psVar6 = (local_100->name_).ptr_;
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        pcVar7 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar7,pcVar7 + psVar6->_M_string_length);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x32ac08);
        ppiVar17 = (int **)(plVar12 + 2);
        if ((int **)*plVar12 == ppiVar17) {
          local_b0 = *ppiVar17;
          _Stack_a8._M_p = (pointer)plVar12[3];
          local_c0._0_8_ = &local_b0;
        }
        else {
          local_b0 = *ppiVar17;
          local_c0._0_8_ = (int **)*plVar12;
        }
        local_c0._8_8_ = plVar12[1];
        *plVar12 = (long)ppiVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_c0);
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          local_e8._0_8_ = *psVar18;
          local_e8._8_8_ = plVar12[3];
          local_f8 = (undefined1  [8])local_e8;
        }
        else {
          local_e8._0_8_ = *psVar18;
          local_f8 = (undefined1  [8])*plVar12;
        }
        local_f0._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((int **)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_,(long)local_b0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        Result::Result(local_140,INVALID_MODEL_PARAMETERS,(string *)local_f8);
        if (local_f8 != (undefined1  [8])local_e8) {
          operator_delete((void *)local_f8,local_e8._0_8_ + 1);
        }
      }
      iVar26 = iVar26 + 1;
    } while (p_Var25 == &local_60._M_impl.super__Rb_tree_header);
    goto LAB_002e7649;
  }
  goto LAB_002e6bb8;
  while (iVar26 = iVar26 + 1, iVar4 != iVar26) {
LAB_002e71ec:
    if (pNVar9->_oneof_case_[0] == 0x460) {
      LVar11 = pNVar9->layer_;
    }
    else {
      LVar11.squeeze_ = Specification::SqueezeLayerParams::default_instance();
    }
    plVar12 = google::protobuf::RepeatedField<long>::Get(&(LVar11.reshape_)->targetshape_,iVar26);
    local_164 = ((int)*plVar12 >> 0x1f & local_168) + (int)*plVar12;
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (local_118,iStack_110._M_current,&local_164);
    iVar8._M_current = iStack_110._M_current;
    if (_Var14._M_current == iStack_110._M_current) {
      if (iStack_110._M_current == local_108) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_118,iStack_110,&local_164);
      }
      else {
        *iStack_110._M_current = local_164;
        iStack_110._M_current = iStack_110._M_current + 1;
      }
    }
    else {
      psVar6 = (pNVar9->name_).ptr_;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,pcVar7,pcVar7 + psVar6->_M_string_length);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x32ac08);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar18 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_160.field_2._M_allocated_capacity = *psVar18;
        local_160.field_2._8_8_ = plVar12[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar18;
        local_160._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_160._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      psVar18 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_188.field_2._M_allocated_capacity = *psVar18;
        local_188.field_2._8_8_ = puVar15[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar18;
        local_188._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_188._M_string_length = puVar15[1];
      *puVar15 = psVar18;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      Result::Result(local_140,INVALID_MODEL_PARAMETERS,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    if (_Var14._M_current != iVar8._M_current) goto LAB_002e762f;
  }
LAB_002e73d4:
  __return_storage_ptr__ = local_140;
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_118->_M_local_buf + 4);
  paVar20 = paVar19;
  paVar23 = local_118;
  paVar24 = local_118;
  if (paVar19 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current &&
      local_118 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current) {
    do {
      paVar23 = paVar20;
      if (*(int *)paVar20 <= *(int *)paVar24) {
        paVar23 = paVar24;
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar20 + 4);
      paVar24 = paVar23;
    } while (paVar20 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_110._M_current);
  }
  paVar20 = local_118;
  paVar24 = local_118;
  if (paVar19 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current &&
      local_118 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current) {
    do {
      paVar24 = paVar19;
      if (*(int *)paVar20 <= *(int *)paVar19) {
        paVar24 = paVar20;
      }
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar19 + 4);
      paVar20 = paVar24;
    } while (paVar19 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_110._M_current);
  }
  if (((int)local_168 <= *(int *)paVar23) || (*(int *)paVar24 < 0)) {
    psVar6 = (pNVar9->name_).ptr_;
    pcVar7 = (psVar6->_M_dataplus)._M_p;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar7,pcVar7 + psVar6->_M_string_length);
    std::operator+(&local_160,"Squeeze Layer \'",&local_138);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_188.field_2._M_allocated_capacity = *psVar18;
      local_188.field_2._8_8_ = puVar15[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar18;
      local_188._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_188._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
LAB_002e762f:
    if (local_118 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar21 = (long)local_108 - (long)local_118;
      _Var22._M_p = (pointer)local_118;
LAB_002e7644:
      operator_delete(_Var22._M_p,uVar21);
    }
LAB_002e7649:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    __return_storage_ptr__ = local_140;
    goto LAB_002e765b;
  }
  if (local_118 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
LAB_002e7470:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
LAB_002e6bb8:
  *(size_type **)__return_storage_ptr__ = local_88;
  paVar19 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p == &local_70) {
    paVar19->_M_allocated_capacity =
         CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_70._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_80._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80._M_p = (pointer)&local_70;
LAB_002e765b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,
                    CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}